

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_to_string.cpp
# Opt level: O0

wstring * __thiscall
mjs::number_to_precision_abi_cxx11_(wstring *__return_storage_ptr__,mjs *this,double x,int p)

{
  bool bVar1;
  bool bVar2;
  ulong uVar3;
  allocator<wchar_t> local_1c1;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_1c0;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_1a0;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_180;
  undefined8 local_160;
  __normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  local_158;
  __normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  local_150;
  __normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  local_148;
  undefined8 local_140;
  wstring local_138;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_118;
  wstring local_f8;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_d8;
  undefined8 local_b8;
  __normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  local_b0;
  __normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  local_a8;
  undefined8 local_a0;
  allocator<wchar_t> local_91;
  undefined1 local_90 [8];
  wstring m;
  int k;
  allocator<wchar_t> local_41;
  undefined1 local_40 [8];
  wstring s;
  double dStack_18;
  int p_local;
  double x_local;
  
  s.field_2._M_local_buf[3] = (wchar_t)this;
  bVar2 = std::isfinite(x);
  bVar1 = false;
  if ((bVar2) && (bVar1 = false, L'\0' < s.field_2._M_local_buf[3])) {
    bVar1 = s.field_2._M_local_buf[3] < L'\x16';
  }
  if (bVar1) {
    std::allocator<wchar_t>::allocator();
    std::__cxx11::wstring::wstring<std::allocator<wchar_t>>((wstring *)local_40,L"",&local_41);
    std::allocator<wchar_t>::~allocator(&local_41);
    dStack_18 = x;
    if (x < 0.0) {
      std::__cxx11::wstring::operator=((wstring *)local_40,L"-");
      dStack_18 = -x;
    }
    anon_unknown_1::do_ecvt
              ((ecvt_result *)((long)&m.field_2 + 8),dStack_18,s.field_2._M_local_buf[3]);
    std::allocator<wchar_t>::allocator();
    std::__cxx11::wstring::wstring<char*,void>
              ((wstring *)local_90,(char *)&k,(char *)((long)&k + (long)m.field_2._M_local_buf[2]),
               &local_91);
    std::allocator<wchar_t>::~allocator(&local_91);
    m.field_2._M_local_buf[3] = m.field_2._M_local_buf[3] + L'\xffffffff';
    if ((m.field_2._M_local_buf[3] < L'\xfffffffa') ||
       (s.field_2._M_local_buf[3] <= m.field_2._M_local_buf[3])) {
      uVar3 = std::__cxx11::wstring::size();
      if (1 < uVar3) {
        local_b0._M_current = (wchar_t *)std::__cxx11::wstring::begin();
        local_a8 = __gnu_cxx::
                   __normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                   ::operator+(&local_b0,1);
        __gnu_cxx::__normal_iterator<wchar_t_const*,std::__cxx11::wstring>::
        __normal_iterator<wchar_t*>
                  ((__normal_iterator<wchar_t_const*,std::__cxx11::wstring> *)&local_a0,&local_a8);
        local_b8 = std::__cxx11::wstring::insert(local_90,local_a0,0x2e);
      }
      if (m.field_2._M_local_buf[3] == L'\0') {
        std::__cxx11::wstring::operator+=((wstring *)local_90,L"e+0");
      }
      else if (m.field_2._M_local_buf[3] < L'\x01') {
        std::__cxx11::to_wstring(&local_138,-m.field_2._M_local_buf[3]);
        std::operator+(&local_118,L"e-",&local_138);
        std::__cxx11::wstring::operator+=((wstring *)local_90,(wstring *)&local_118);
        std::__cxx11::wstring::~wstring((wstring *)&local_118);
        std::__cxx11::wstring::~wstring((wstring *)&local_138);
      }
      else {
        std::__cxx11::to_wstring(&local_f8,m.field_2._M_local_buf[3]);
        std::operator+(&local_d8,L"e+",&local_f8);
        std::__cxx11::wstring::operator+=((wstring *)local_90,(wstring *)&local_d8);
        std::__cxx11::wstring::~wstring((wstring *)&local_d8);
        std::__cxx11::wstring::~wstring((wstring *)&local_f8);
      }
    }
    else if (m.field_2._M_local_buf[3] != s.field_2._M_local_buf[3] + L'\xffffffff') {
      if (m.field_2._M_local_buf[3] < L'\0') {
        uVar3 = (ulong)m.field_2._M_local_buf[3];
        std::allocator<wchar_t>::allocator();
        std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
                  ((wstring *)&local_1c0,~uVar3,L'0',&local_1c1);
        std::operator+(&local_1a0,L"0.",&local_1c0);
        std::operator+(&local_180,&local_1a0,
                       (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *
                       )local_90);
        std::__cxx11::wstring::operator=((wstring *)local_90,(wstring *)&local_180);
        std::__cxx11::wstring::~wstring((wstring *)&local_180);
        std::__cxx11::wstring::~wstring((wstring *)&local_1a0);
        std::__cxx11::wstring::~wstring((wstring *)&local_1c0);
        std::allocator<wchar_t>::~allocator(&local_1c1);
      }
      else {
        local_158._M_current = (wchar_t *)std::__cxx11::wstring::begin();
        local_150 = __gnu_cxx::
                    __normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                    ::operator+(&local_158,(long)m.field_2._M_local_buf[3]);
        local_148 = __gnu_cxx::
                    __normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                    ::operator+(&local_150,1);
        __gnu_cxx::__normal_iterator<wchar_t_const*,std::__cxx11::wstring>::
        __normal_iterator<wchar_t*>
                  ((__normal_iterator<wchar_t_const*,std::__cxx11::wstring> *)&local_140,&local_148)
        ;
        local_160 = std::__cxx11::wstring::insert(local_90,local_140,0x2e);
      }
    }
    std::operator+(__return_storage_ptr__,
                   (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                   local_40,(basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                             *)local_90);
    std::__cxx11::wstring::~wstring((wstring *)local_90);
    std::__cxx11::wstring::~wstring((wstring *)local_40);
    return __return_storage_ptr__;
  }
  __assert_fail("std::isfinite(x) && p >= 1 && p <= 21",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/number_to_string.cpp"
                ,0xd9,"std::wstring mjs::number_to_precision(double, int)");
}

Assistant:

std::wstring number_to_precision(double x, int p) {
    // HACK HACK
    assert(std::isfinite(x) && p >= 1 && p <= 21);
    std::wstring s = L"";
    if (x < 0) {
        s = L"-";
        x = -x;
    }

    auto [k, e, digits] = do_ecvt(x, p);
    std::wstring m = std::wstring{digits, digits+k};
    e--;
    if (e < -6 || e >= p) {
        if (m.size() > 1) {
            m.insert(m.begin() + 1, L'.');
        }
        if (e == 0) {
            m += L"e+0";
        } else if (e > 0) {
            m += L"e+" + std::to_wstring(e);
        } else {
            m += L"e-" + std::to_wstring(-e);
        }
    } else if (e == p - 1) {
    } else if (e >= 0) {
        m.insert(m.begin() + e + 1, L'.');
    } else {
        m = L"0." + std::wstring(-(e+1), L'0') + m;
    }

    return s + m;
}